

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caller.hpp
# Opt level: O0

PyObject * __thiscall
boost::python::detail::caller_arity<8U>::
impl<unsigned_char_(StimulationCommand::*)(unsigned_short,_unsigned_char,_unsigned_short,_unsigned_char,_unsigned_short,_unsigned_short,_unsigned_short),_boost::python::default_call_policies,_boost::mpl::vector9<unsigned_char,_StimulationCommand_&,_unsigned_short,_unsigned_char,_unsigned_short,_unsigned_char,_unsigned_short,_unsigned_short,_unsigned_short>_>
::operator()(impl<unsigned_char_(StimulationCommand::*)(unsigned_short,_unsigned_char,_unsigned_short,_unsigned_char,_unsigned_short,_unsigned_short,_unsigned_short),_boost::python::default_call_policies,_boost::mpl::vector9<unsigned_char,_StimulationCommand_&,_unsigned_short,_unsigned_char,_unsigned_short,_unsigned_char,_unsigned_short,_unsigned_short,_unsigned_short>_>
             *this,PyObject *args_,PyObject *param_3)

{
  bool bVar1;
  first_reference pfVar2;
  PyObject *result;
  c_t7 c7;
  c_t6 c6;
  c_t5 c5;
  c_t4 c4;
  c_t3 c3;
  c_t2 c2;
  c_t1 c1;
  c_t0 c0;
  argument_package inner_args;
  PyObject *in_stack_fffffffffffffe08;
  arg_from_python<unsigned_char> *in_stack_fffffffffffffe10;
  undefined1 local_16b [3];
  PyObject *local_168;
  arg_rvalue_from_python<unsigned_short> local_158;
  arg_rvalue_from_python<unsigned_short> local_130;
  arg_rvalue_from_python<unsigned_short> local_108;
  arg_rvalue_from_python<unsigned_char> local_e0;
  arg_rvalue_from_python<unsigned_short> local_b8;
  arg_rvalue_from_python<unsigned_char> local_90;
  undefined4 local_70;
  arg_rvalue_from_python<unsigned_short> local_58;
  arg_lvalue_from_python_base local_30;
  _object *local_28 [2];
  _object *local_18 [2];
  PyObject *local_8;
  
  get<0>(local_28);
  arg_from_python<StimulationCommand_&>::arg_from_python
            ((arg_from_python<StimulationCommand_&> *)in_stack_fffffffffffffe10,
             in_stack_fffffffffffffe08);
  bVar1 = converter::arg_lvalue_from_python_base::convertible(&local_30);
  if (bVar1) {
    get<1>(local_28);
    arg_from_python<unsigned_short>::arg_from_python
              ((arg_from_python<unsigned_short> *)in_stack_fffffffffffffe10,
               in_stack_fffffffffffffe08);
    bVar1 = converter::arg_rvalue_from_python<unsigned_short>::convertible(&local_58);
    if (bVar1) {
      get<2>(local_28);
      arg_from_python<unsigned_char>::arg_from_python
                (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
      bVar1 = converter::arg_rvalue_from_python<unsigned_char>::convertible(&local_90);
      if (bVar1) {
        get<3>(local_28);
        arg_from_python<unsigned_short>::arg_from_python
                  ((arg_from_python<unsigned_short> *)in_stack_fffffffffffffe10,
                   in_stack_fffffffffffffe08);
        bVar1 = converter::arg_rvalue_from_python<unsigned_short>::convertible(&local_b8);
        if (bVar1) {
          get<4>(local_28);
          arg_from_python<unsigned_char>::arg_from_python
                    (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
          bVar1 = converter::arg_rvalue_from_python<unsigned_char>::convertible(&local_e0);
          if (bVar1) {
            get<5>(local_28);
            arg_from_python<unsigned_short>::arg_from_python
                      ((arg_from_python<unsigned_short> *)in_stack_fffffffffffffe10,
                       in_stack_fffffffffffffe08);
            bVar1 = converter::arg_rvalue_from_python<unsigned_short>::convertible(&local_108);
            if (bVar1) {
              get<6>(local_28);
              arg_from_python<unsigned_short>::arg_from_python
                        ((arg_from_python<unsigned_short> *)in_stack_fffffffffffffe10,
                         in_stack_fffffffffffffe08);
              bVar1 = converter::arg_rvalue_from_python<unsigned_short>::convertible(&local_130);
              if (bVar1) {
                get<7>(local_28);
                arg_from_python<unsigned_short>::arg_from_python
                          ((arg_from_python<unsigned_short> *)in_stack_fffffffffffffe10,
                           in_stack_fffffffffffffe08);
                bVar1 = converter::arg_rvalue_from_python<unsigned_short>::convertible(&local_158);
                if (bVar1) {
                  compressed_pair<unsigned_char_(StimulationCommand::*)(unsigned_short,_unsigned_char,_unsigned_short,_unsigned_char,_unsigned_short,_unsigned_short,_unsigned_short),_boost::python::default_call_policies>
                  ::second((compressed_pair<unsigned_char_(StimulationCommand::*)(unsigned_short,_unsigned_char,_unsigned_short,_unsigned_char,_unsigned_short,_unsigned_short,_unsigned_short),_boost::python::default_call_policies>
                            *)0x3b0e2a);
                  bVar1 = default_call_policies::precall<_object*>(local_28);
                  if (bVar1) {
                    create_result_converter<_object*,boost::python::to_python_value<unsigned_char_const&>>
                              (local_18,(to_python_value<const_unsigned_char_&> *)0x0);
                    pfVar2 = compressed_pair<unsigned_char_(StimulationCommand::*)(unsigned_short,_unsigned_char,_unsigned_short,_unsigned_char,_unsigned_short,_unsigned_short,_unsigned_short),_boost::python::default_call_policies>
                             ::first((compressed_pair<unsigned_char_(StimulationCommand::*)(unsigned_short,_unsigned_char,_unsigned_short,_unsigned_char,_unsigned_short,_unsigned_short,_unsigned_short),_boost::python::default_call_policies>
                                      *)0x3b0e7c);
                    local_168 = invoke<boost::python::to_python_value<unsigned_char_const&>,unsigned_char(StimulationCommand::*)(unsigned_short,unsigned_char,unsigned_short,unsigned_char,unsigned_short,unsigned_short,unsigned_short),boost::python::arg_from_python<StimulationCommand&>,boost::python::arg_from_python<unsigned_short>,boost::python::arg_from_python<unsigned_char>,boost::python::arg_from_python<unsigned_short>,boost::python::arg_from_python<unsigned_char>,boost::python::arg_from_python<unsigned_short>,boost::python::arg_from_python<unsigned_short>,boost::python::arg_from_python<unsigned_short>>
                                          (local_16b,pfVar2,&local_30,&local_58,&local_90,&local_b8,
                                           &local_e0,&local_108,&local_130,&local_158);
                    compressed_pair<unsigned_char_(StimulationCommand::*)(unsigned_short,_unsigned_char,_unsigned_short,_unsigned_char,_unsigned_short,_unsigned_short,_unsigned_short),_boost::python::default_call_policies>
                    ::second((compressed_pair<unsigned_char_(StimulationCommand::*)(unsigned_short,_unsigned_char,_unsigned_short,_unsigned_char,_unsigned_short,_unsigned_short,_unsigned_short),_boost::python::default_call_policies>
                              *)0x3b0f08);
                    local_8 = default_call_policies::postcall<_object*>(local_28,local_168);
                  }
                  else {
                    local_8 = (PyObject *)0x0;
                  }
                }
                else {
                  local_8 = (PyObject *)0x0;
                }
                local_70 = 1;
                arg_from_python<unsigned_short>::~arg_from_python
                          ((arg_from_python<unsigned_short> *)0x3b0f3f);
              }
              else {
                local_8 = (PyObject *)0x0;
                local_70 = 1;
              }
              arg_from_python<unsigned_short>::~arg_from_python
                        ((arg_from_python<unsigned_short> *)0x3b0f4c);
            }
            else {
              local_8 = (PyObject *)0x0;
              local_70 = 1;
            }
            arg_from_python<unsigned_short>::~arg_from_python
                      ((arg_from_python<unsigned_short> *)0x3b0f6a);
          }
          else {
            local_8 = (PyObject *)0x0;
            local_70 = 1;
          }
          arg_from_python<unsigned_char>::~arg_from_python
                    ((arg_from_python<unsigned_char> *)0x3b0f88);
        }
        else {
          local_8 = (PyObject *)0x0;
          local_70 = 1;
        }
        arg_from_python<unsigned_short>::~arg_from_python
                  ((arg_from_python<unsigned_short> *)0x3b0fa6);
      }
      else {
        local_8 = (PyObject *)0x0;
        local_70 = 1;
      }
      arg_from_python<unsigned_char>::~arg_from_python((arg_from_python<unsigned_char> *)0x3b0fc4);
    }
    else {
      local_8 = (PyObject *)0x0;
      local_70 = 1;
    }
    arg_from_python<unsigned_short>::~arg_from_python((arg_from_python<unsigned_short> *)0x3b0fe2);
  }
  else {
    local_8 = (PyObject *)0x0;
  }
  return local_8;
}

Assistant:

PyObject* operator()(PyObject* args_, PyObject*) // eliminate
                                                         // this
                                                         // trailing
                                                         // keyword dict
        {
            typedef typename mpl::begin<Sig>::type first;
            typedef typename first::type result_t;
            typedef typename select_result_converter<Policies, result_t>::type result_converter;
            typedef typename Policies::argument_package argument_package;
            
            argument_package inner_args(args_);

# if N
#  define BOOST_PP_LOCAL_MACRO(i) BOOST_PYTHON_ARG_CONVERTER(i)
#  define BOOST_PP_LOCAL_LIMITS (0, N-1)
#  include BOOST_PP_LOCAL_ITERATE()
# endif 
            // all converters have been checked. Now we can do the
            // precall part of the policy
            if (!m_data.second().precall(inner_args))
                return 0;

            PyObject* result = detail::invoke(
                detail::invoke_tag<result_t,F>()
              , create_result_converter(args_, (result_converter*)0, (result_converter*)0)
              , m_data.first()
                BOOST_PP_ENUM_TRAILING_PARAMS(N, c)
            );
            
            return m_data.second().postcall(inner_args, result);
        }